

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallRuntimeDependencySetGenerator::cmInstallRuntimeDependencySetGenerator
          (cmInstallRuntimeDependencySetGenerator *this,DependencyType type,
          cmInstallRuntimeDependencySet *dependencySet,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *installRPaths,bool noInstallRPath,string *installNameDir,bool noInstallName,char *depsVar
          ,char *rpathPrefix,char *tmpVarPrefix,string *destination,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,string *component,string *permissions,MessageLevel message,
          bool exclude_from_all,cmListFileBacktrace *backtrace)

{
  byte bVar1;
  cmListFileBacktrace local_90;
  string local_80;
  string local_60;
  byte local_3a;
  byte local_39;
  bool exclude_from_all_local;
  string *psStack_38;
  bool noInstallName_local;
  string *installNameDir_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_28;
  bool noInstallRPath_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *installRPaths_local;
  cmInstallRuntimeDependencySet *dependencySet_local;
  cmInstallRuntimeDependencySetGenerator *pcStack_10;
  DependencyType type_local;
  cmInstallRuntimeDependencySetGenerator *this_local;
  
  local_39 = noInstallName;
  local_3a = exclude_from_all;
  psStack_38 = installNameDir;
  installNameDir_local._7_1_ = noInstallRPath;
  pvStack_28 = installRPaths;
  installRPaths_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)dependencySet;
  dependencySet_local._4_4_ = type;
  pcStack_10 = this;
  std::__cxx11::string::string((string *)&local_60,(string *)destination);
  std::__cxx11::string::string((string *)&local_80,(string *)component);
  bVar1 = local_3a;
  cmListFileBacktrace::cmListFileBacktrace(&local_90,backtrace);
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,&local_60,configurations,&local_80,message,
             (bool)(bVar1 & 1),false,&local_90);
  cmListFileBacktrace::~cmListFileBacktrace(&local_90);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallRuntimeDependencySetGenerator_00f4fe30;
  this->Type = dependencySet_local._4_4_;
  this->DependencySet = (cmInstallRuntimeDependencySet *)installRPaths_local;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->InstallRPaths,installRPaths);
  this->NoInstallRPath = (bool)(installNameDir_local._7_1_ & 1);
  std::__cxx11::string::string((string *)&this->InstallNameDir,(string *)installNameDir);
  this->NoInstallName = (bool)(local_39 & 1);
  std::__cxx11::string::string((string *)&this->Permissions,(string *)permissions);
  this->DepsVar = depsVar;
  this->RPathPrefix = rpathPrefix;
  this->TmpVarPrefix = tmpVarPrefix;
  this->LocalGenerator = (cmLocalGenerator *)0x0;
  (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
  return;
}

Assistant:

cmInstallRuntimeDependencySetGenerator::cmInstallRuntimeDependencySetGenerator(
  DependencyType type, cmInstallRuntimeDependencySet* dependencySet,
  std::vector<std::string> installRPaths, bool noInstallRPath,
  std::string installNameDir, bool noInstallName, const char* depsVar,
  const char* rpathPrefix, const char* tmpVarPrefix, std::string destination,
  std::vector<std::string> const& configurations, std::string component,
  std::string permissions, MessageLevel message, bool exclude_from_all,
  cmListFileBacktrace backtrace)
  : cmInstallGenerator(std::move(destination), configurations,
                       std::move(component), message, exclude_from_all, false,
                       std::move(backtrace))
  , Type(type)
  , DependencySet(dependencySet)
  , InstallRPaths(std::move(installRPaths))
  , NoInstallRPath(noInstallRPath)
  , InstallNameDir(std::move(installNameDir))
  , NoInstallName(noInstallName)
  , Permissions(std::move(permissions))
  , DepsVar(depsVar)
  , RPathPrefix(rpathPrefix)
  , TmpVarPrefix(tmpVarPrefix)
{
  this->ActionsPerConfig = true;
}